

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig::Serialize
          (HeapprofdConfig_ContinuousDumpConfig *this,Message *msg)

{
  uint8_t *src_begin;
  ulong uVar1;
  
  uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  if ((uVar1 & 0x20) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,5,this->dump_phase_ms_);
    uVar1 = (this->_has_field_).super__Base_bitset<1UL>._M_w;
  }
  if ((uVar1 & 0x40) != 0) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,6,this->dump_interval_ms_);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void HeapprofdConfig_ContinuousDumpConfig::Serialize(::protozero::Message* msg) const {
  // Field 5: dump_phase_ms
  if (_has_field_[5]) {
    msg->AppendVarInt(5, dump_phase_ms_);
  }

  // Field 6: dump_interval_ms
  if (_has_field_[6]) {
    msg->AppendVarInt(6, dump_interval_ms_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}